

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedicated.cpp
# Opt level: O2

void anon_unknown.dwarf_14675a::Dedicated_setParamf(EffectProps *props,ALenum param,float val)

{
  effect_exception *this;
  
  if (param == 1) {
    if ((int)ABS(val) - 0x800000U < 0x7f000000 && -1 < (int)val ||
        (ABS(val) == 0.0 || (int)val - 1U < 0x7fffff)) {
      (props->Reverb).Density = val;
      return;
    }
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception(this,0xa003,"Dedicated gain out of range");
  }
  else {
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception
              (this,0xa002,"Invalid dedicated float property 0x%04x",(ulong)(uint)param);
  }
  __cxa_throw(this,&effect_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void Dedicated_setParamf(EffectProps *props, ALenum param, float val)
{
    switch(param)
    {
    case AL_DEDICATED_GAIN:
        if(!(val >= 0.0f && std::isfinite(val)))
            throw effect_exception{AL_INVALID_VALUE, "Dedicated gain out of range"};
        props->Dedicated.Gain = val;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid dedicated float property 0x%04x", param};
    }
}